

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image_utils.cpp
# Opt level: O1

conversion_type crnlib::image_utils::get_image_conversion_type_from_crn_format(crn_format fmt)

{
  conversion_type cVar1;
  
  cVar1 = cConversion_Invalid;
  if ((ulong)(fmt + ~cCRNFmtDXT5) < 4) {
    cVar1 = (int)(fmt + ~cCRNFmtDXT5) * 2;
  }
  return cVar1;
}

Assistant:

image_utils::conversion_type get_image_conversion_type_from_crn_format(crn_format fmt)
        {
            switch (fmt)
            {
            case cCRNFmtDXT5_CCxY:
                return image_utils::cConversion_To_CCxY;
            case cCRNFmtDXT5_xGxR:
                return image_utils::cConversion_To_xGxR;
            case cCRNFmtDXT5_xGBR:
                return image_utils::cConversion_To_xGBR;
            case cCRNFmtDXT5_AGBR:
                return image_utils::cConversion_To_AGBR;
            default:
                break;
            }
            return image_utils::cConversion_Invalid;
        }